

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar5;
  value_type vVar6;
  double dVar7;
  value_type vVar8;
  double dVar9;
  
  vVar6 = FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
          ::dx(&this->left_->fadexpr_,i);
  pFVar3 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  dVar7 = sinh(((pFVar3->fadexpr_).left_.constant_ * ((pFVar3->fadexpr_).right_)->val_) /
               (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_);
  vVar8 = FadExpr<FadFuncSinh<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
          ::dx(this->right_,i);
  pFVar4 = (this->left_->fadexpr_).left_;
  dVar1 = ((pFVar4->fadexpr_).left_)->val_;
  dVar2 = ((pFVar4->fadexpr_).right_)->val_;
  pFVar5 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar5->fadexpr_).expr_.fadexpr_.left_;
  dVar9 = cos(((pFVar3->fadexpr_).left_.constant_ * ((pFVar3->fadexpr_).right_)->val_) /
              (pFVar5->fadexpr_).expr_.fadexpr_.right_.constant_);
  return dVar9 * (dVar1 / dVar2) * vVar8 + dVar7 * vVar6;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}